

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool ReadMeshNgons(ON_BinaryArchive *file,ON_MeshNgonAllocator *a,
                  ON_SimpleArray<ON_MeshNgon_*> *ngons)

{
  bool bVar1;
  ON_MeshNgon *local_50;
  ON_MeshNgon *ngon;
  byte local_3d;
  uint ngon_count;
  uint uStack_38;
  bool rc;
  uint Fcount;
  uint Vcount;
  uint i;
  int minor_version;
  int major_version;
  ON_SimpleArray<ON_MeshNgon_*> *ngons_local;
  ON_MeshNgonAllocator *a_local;
  ON_BinaryArchive *file_local;
  
  _minor_version = ngons;
  ngons_local = (ON_SimpleArray<ON_MeshNgon_*> *)a;
  a_local = (ON_MeshNgonAllocator *)file;
  ON_SimpleArray<ON_MeshNgon_*>::SetCount(ngons,0);
  i = 0;
  Vcount = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    ((ON_BinaryArchive *)a_local,0x40008000,(int *)&i,(int *)&Vcount);
  if (bVar1) {
    local_3d = 0;
    ngon._4_4_ = 0;
    bVar1 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)a_local,(ON__UINT32 *)((long)&ngon + 4));
    if (bVar1) {
      ON_SimpleArray<ON_MeshNgon_*>::Reserve(_minor_version,(ulong)ngon._4_4_);
      for (Fcount = 0; Fcount < ngon._4_4_; Fcount = Fcount + 1) {
        uStack_38 = 0;
        bVar1 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)a_local,&stack0xffffffffffffffc8);
        if (!bVar1) break;
        if (uStack_38 != 0) {
          bVar1 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)a_local,&ngon_count);
          if (!bVar1) break;
          local_50 = ON_MeshNgonAllocator::AllocateNgon
                               ((ON_MeshNgonAllocator *)ngons_local,uStack_38,ngon_count);
          bVar1 = ON_BinaryArchive::ReadInt
                            ((ON_BinaryArchive *)a_local,(ulong)uStack_38,local_50->m_vi);
          if ((!bVar1) ||
             (bVar1 = ON_BinaryArchive::ReadInt
                                ((ON_BinaryArchive *)a_local,(ulong)local_50->m_Fcount,
                                 local_50->m_fi), !bVar1)) break;
          ON_SimpleArray<ON_MeshNgon_*>::Append(_minor_version,&local_50);
        }
      }
      if (Fcount == ngon._4_4_) {
        local_3d = 1;
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk((ON_BinaryArchive *)a_local);
    if (!bVar1) {
      local_3d = 0;
    }
    file_local._7_1_ = (bool)(local_3d & 1);
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

static
bool ReadMeshNgons( ON_BinaryArchive& file, ON_MeshNgonAllocator& a, ON_SimpleArray<ON_MeshNgon*>& ngons )
{
  ngons.SetCount(0);

  int major_version = 0;
  int minor_version = 0;
  unsigned int i, Vcount, Fcount;
  if ( !file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version) )
    return false;

  bool rc = false;
  for(;;)
  {
    unsigned int ngon_count = 0;
    if (!file.ReadInt(&ngon_count))
      break;

    ngons.Reserve(ngon_count);

    for ( i = 0; i < ngon_count; i++)
    {
      Vcount = 0;
      if ( !file.ReadInt(&Vcount) )
        break;
      if ( Vcount <= 0 )
        continue;
      if ( !file.ReadInt(&Fcount) )
        break;
      ON_MeshNgon* ngon = a.AllocateNgon(Vcount,Fcount);
      if ( !file.ReadInt(Vcount,ngon->m_vi) )
        break;
      if ( !file.ReadInt(ngon->m_Fcount,ngon->m_fi) )
        break;
      ngons.Append(ngon);
    }

    if (i == ngon_count)
      rc = true;

    break;
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}